

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O2

void __thiscall
UnifiedRegex::CharBitvec::ToEquivClass<char16_t>
          (CharBitvec *this,ArenaAllocator *allocator,uint base,uint *tblidx,
          CharSet<char16_t> *result,codepoint_t baseOffset)

{
  Char c;
  code *pcVar1;
  bool bVar2;
  Char hc;
  int iVar3;
  int iVar4;
  undefined4 *puVar5;
  uint h;
  uint l;
  int i;
  long lVar6;
  char16 local_68 [4];
  char16_t equivl [4];
  uint local_34 [2];
  uint acth;
  
  equivl = (char16_t  [4])tblidx;
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  iVar4 = -1;
  do {
    iVar3 = NextSet(this,iVar4 + 1);
    if (iVar3 < 0) {
      return;
    }
    iVar4 = NextClear(this,iVar3 + 1);
    if (iVar4 < 0) {
      iVar4 = 0xff;
    }
    else {
      if (iVar4 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                           ,0xa9,"(hi > 0)","hi > 0");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar5 = 0;
      }
      iVar4 = iVar4 + -1;
    }
    l = iVar3 + base + baseOffset;
    h = base + baseOffset + iVar4;
    do {
      CaseInsensitive::RangeToEquivClass((uint *)equivl,l,h,local_34,local_68);
      iVar3 = local_34[0] - l;
      for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
        c = local_68[lVar6];
        hc = Chars<char16_t>::Shift(c,iVar3);
        CharSet<char16_t>::SetRange(result,allocator,c,hc);
      }
      l = local_34[0] + 1;
    } while (l <= h);
  } while( true );
}

Assistant:

void CharBitvec::ToEquivClass(ArenaAllocator* allocator, uint base, uint& tblidx, CharSet<C>& result, codepoint_t baseOffset) const
    {
        int hi = -1;
        while (true)
        {
            // Find the next range of set bits in vector
            int li = NextSet(hi + 1);
            if (li < 0)
                return;
            hi = NextClear(li + 1);
            if (hi < 0)
                hi = Size - 1;
            else
            {
                Assert(hi > 0);
                hi--;
            }

            // Convert to character codes
            uint l = base + li + baseOffset;
            uint h = base + hi + baseOffset;

            do
            {
                uint acth;
                C equivl[CaseInsensitive::EquivClassSize];
                CaseInsensitive::RangeToEquivClass(tblidx, l, h, acth, equivl);
                uint n = acth - l;
                for (int i = 0; i < CaseInsensitive::EquivClassSize; i++)
                {
                    result.SetRange(allocator, equivl[i], Chars<C>::Shift(equivl[i], n));
                }

                // Go around again for rest of this range
                l = acth + 1;
            }
            while (l <= h);
        }
    }